

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusTanFixedRadiusArc.cpp
# Opt level: O2

bool ParseLocusTanFixedRadiusArc(string *sLine1,string *sLine2,string *sLine3)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int arcDirection;
  string sTestId;
  string sPtIntLon;
  string sPtIntLat;
  LLPoint intersection2;
  LLPoint intersection1;
  double local_7c0;
  string sTanPt2Lon;
  string sTanPt2Lat;
  string sTanPt1Lon;
  string sTanPt1Lat;
  Locus locus1;
  LLPoint arcCenter;
  string sArcDirection;
  string local_6a8;
  string sArcRadius;
  string sLocus2EndDist;
  string sLocus2StartDist;
  string sLocus2EndLong;
  string sLocus2EndLat;
  string sLocus2StartLong;
  string sLocus2StartLat;
  string sLocus2GeoEndLong;
  string sLocus2GeoEndLat;
  string sLocus2GeoStartLong;
  string sLocus2GeoStartLat;
  string sLocus1EndDist;
  string sLocus1StartDist;
  string sLocus1EndLong;
  string sLocus1EndLat;
  string sLocus1StartLong;
  string sLocus1StartLat;
  string sLocus1GeoEndLong;
  string sLocus1GeoEndLat;
  string sLocus1GeoStartLong;
  string sLocus1GeoStartLat;
  Locus locus2;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string sCenterLon;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string sArcCenterLon;
  string sArcCenterLat;
  string sCenterLat;
  
  sLocus1GeoStartLat._M_dataplus._M_p = (pointer)&sLocus1GeoStartLat.field_2;
  sLocus1GeoStartLat._M_string_length = 0;
  sLocus1GeoStartLong._M_dataplus._M_p = (pointer)&sLocus1GeoStartLong.field_2;
  sLocus1GeoStartLong._M_string_length = 0;
  sLocus1GeoStartLat.field_2._M_local_buf[0] = '\0';
  sLocus1GeoStartLong.field_2._M_local_buf[0] = '\0';
  sLocus1GeoEndLat._M_dataplus._M_p = (pointer)&sLocus1GeoEndLat.field_2;
  sLocus1GeoEndLat._M_string_length = 0;
  sLocus1GeoEndLong._M_dataplus._M_p = (pointer)&sLocus1GeoEndLong.field_2;
  sLocus1GeoEndLong._M_string_length = 0;
  sLocus1GeoEndLat.field_2._M_local_buf[0] = '\0';
  sLocus1GeoEndLong.field_2._M_local_buf[0] = '\0';
  sLocus1StartLat._M_dataplus._M_p = (pointer)&sLocus1StartLat.field_2;
  sLocus1StartLat._M_string_length = 0;
  sLocus1StartLong._M_dataplus._M_p = (pointer)&sLocus1StartLong.field_2;
  sLocus1StartLong._M_string_length = 0;
  sLocus1StartLat.field_2._M_local_buf[0] = '\0';
  sLocus1StartLong.field_2._M_local_buf[0] = '\0';
  sLocus1EndLat._M_dataplus._M_p = (pointer)&sLocus1EndLat.field_2;
  sLocus1EndLat._M_string_length = 0;
  sLocus1EndLong._M_dataplus._M_p = (pointer)&sLocus1EndLong.field_2;
  sLocus1EndLong._M_string_length = 0;
  sLocus1EndLat.field_2._M_local_buf[0] = '\0';
  sLocus1EndLong.field_2._M_local_buf[0] = '\0';
  sLocus1StartDist._M_dataplus._M_p = (pointer)&sLocus1StartDist.field_2;
  sLocus1StartDist._M_string_length = 0;
  sLocus1EndDist._M_dataplus._M_p = (pointer)&sLocus1EndDist.field_2;
  sLocus1EndDist._M_string_length = 0;
  sLocus1StartDist.field_2._M_local_buf[0] = '\0';
  sLocus1EndDist.field_2._M_local_buf[0] = '\0';
  sLocus2GeoStartLat._M_dataplus._M_p = (pointer)&sLocus2GeoStartLat.field_2;
  sLocus2GeoStartLat._M_string_length = 0;
  sLocus2GeoStartLong._M_dataplus._M_p = (pointer)&sLocus2GeoStartLong.field_2;
  sLocus2GeoStartLong._M_string_length = 0;
  sLocus2GeoStartLat.field_2._M_local_buf[0] = '\0';
  sLocus2GeoStartLong.field_2._M_local_buf[0] = '\0';
  sLocus2GeoEndLat._M_dataplus._M_p = (pointer)&sLocus2GeoEndLat.field_2;
  sLocus2GeoEndLat._M_string_length = 0;
  sLocus2GeoEndLong._M_dataplus._M_p = (pointer)&sLocus2GeoEndLong.field_2;
  sLocus2GeoEndLong._M_string_length = 0;
  sLocus2GeoEndLat.field_2._M_local_buf[0] = '\0';
  sLocus2GeoEndLong.field_2._M_local_buf[0] = '\0';
  sLocus2StartLat._M_dataplus._M_p = (pointer)&sLocus2StartLat.field_2;
  sLocus2StartLat._M_string_length = 0;
  sLocus2StartLong._M_dataplus._M_p = (pointer)&sLocus2StartLong.field_2;
  sLocus2StartLong._M_string_length = 0;
  sLocus2StartLat.field_2._M_local_buf[0] = '\0';
  sLocus2StartLong.field_2._M_local_buf[0] = '\0';
  sLocus2EndLat._M_dataplus._M_p = (pointer)&sLocus2EndLat.field_2;
  sLocus2EndLat._M_string_length = 0;
  sLocus2EndLong._M_dataplus._M_p = (pointer)&sLocus2EndLong.field_2;
  sLocus2EndLong._M_string_length = 0;
  sLocus2EndLat.field_2._M_local_buf[0] = '\0';
  sLocus2EndLong.field_2._M_local_buf[0] = '\0';
  sLocus2StartDist._M_dataplus._M_p = (pointer)&sLocus2StartDist.field_2;
  sLocus2StartDist._M_string_length = 0;
  sLocus2EndDist._M_dataplus._M_p = (pointer)&sLocus2EndDist.field_2;
  sLocus2EndDist._M_string_length = 0;
  sLocus2StartDist.field_2._M_local_buf[0] = '\0';
  sLocus2EndDist.field_2._M_local_buf[0] = '\0';
  sArcRadius._M_dataplus._M_p = (pointer)&sArcRadius.field_2;
  sArcRadius._M_string_length = 0;
  sArcDirection._M_dataplus._M_p = (pointer)&sArcDirection.field_2;
  sArcDirection._M_string_length = 0;
  sArcRadius.field_2._M_local_buf[0] = '\0';
  sArcDirection.field_2._M_local_buf[0] = '\0';
  sArcCenterLat._M_dataplus._M_p = (pointer)&sArcCenterLat.field_2;
  sArcCenterLat._M_string_length = 0;
  sArcCenterLon._M_dataplus._M_p = (pointer)&sArcCenterLon.field_2;
  sArcCenterLon._M_string_length = 0;
  sArcCenterLat.field_2._M_local_buf[0] = '\0';
  sArcCenterLon.field_2._M_local_buf[0] = '\0';
  sTanPt1Lat._M_dataplus._M_p = (pointer)&sTanPt1Lat.field_2;
  sTanPt1Lat._M_string_length = 0;
  sTanPt1Lon._M_dataplus._M_p = (pointer)&sTanPt1Lon.field_2;
  sTanPt1Lon._M_string_length = 0;
  sTanPt1Lat.field_2._M_local_buf[0] = '\0';
  sTanPt1Lon.field_2._M_local_buf[0] = '\0';
  sTanPt2Lat._M_dataplus._M_p = (pointer)&sTanPt2Lat.field_2;
  sTanPt2Lat._M_string_length = 0;
  sTanPt2Lon._M_dataplus._M_p = (pointer)&sTanPt2Lon.field_2;
  sTanPt2Lon._M_string_length = 0;
  sTanPt2Lat.field_2._M_local_buf[0] = '\0';
  sTanPt2Lon.field_2._M_local_buf[0] = '\0';
  sTestId._M_dataplus._M_p = (pointer)&sTestId.field_2;
  sTestId._M_string_length = 0;
  sTestId.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_b0,(string *)sLine1);
  bVar1 = ParseLocusTanFixedRadiusArc1
                    (&local_b0,&sTestId,&sLocus1GeoStartLat,&sLocus1GeoStartLong,&sLocus1GeoEndLat,
                     &sLocus1GeoEndLong,&sLocus1StartLat,&sLocus1StartLong,&sLocus1EndLat,
                     &sLocus1EndLong,&sLocus1StartDist,&sLocus1EndDist);
  std::__cxx11::string::~string((string *)&local_b0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_d0,(string *)sLine2);
    bVar1 = ParseLocusTanFixedRadiusArc2
                      (&local_d0,&sLocus2GeoStartLat,&sLocus2GeoStartLong,&sLocus2GeoEndLat,
                       &sLocus2GeoEndLong,&sLocus2StartLat,&sLocus2StartLong,&sLocus2EndLat,
                       &sLocus2EndLong,&sLocus2StartDist,&sLocus2EndDist,&sArcRadius);
    std::__cxx11::string::~string((string *)&local_d0);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_f0,(string *)sLine3);
      bVar1 = ParseLocusTanFixedRadiusArc3
                        (&local_f0,&sArcDirection,&sArcCenterLat,&sArcCenterLon,&sTanPt1Lat,
                         &sTanPt1Lon,&sTanPt2Lat,&sTanPt2Lon);
      std::__cxx11::string::~string((string *)&local_f0);
      if (bVar1) {
        locus1.startDist = 0.0;
        locus1.endDist = 0.0;
        locus1.locusEnd.latitude = 0.0;
        locus1.locusEnd.longitude = 0.0;
        locus1.locusStart.latitude = 0.0;
        locus1.locusStart.longitude = 0.0;
        locus1.geoEnd.latitude = 0.0;
        locus1.geoEnd.longitude = 0.0;
        locus1.geoStart.latitude = 0.0;
        locus1.geoStart.longitude = 0.0;
        locus1.lineType = 0;
        locus2.startDist = 0.0;
        locus2.endDist = 0.0;
        locus2.locusEnd.latitude = 0.0;
        locus2.locusEnd.longitude = 0.0;
        locus2.locusStart.latitude = 0.0;
        locus2.locusStart.longitude = 0.0;
        locus2.geoEnd.latitude = 0.0;
        locus2.geoEnd.longitude = 0.0;
        locus2.geoStart.latitude = 0.0;
        locus2.geoStart.longitude = 0.0;
        locus2.lineType = 0;
        std::__cxx11::string::string((string *)&local_110,(string *)&sLocus1GeoStartLat);
        dVar4 = ParseLatitude(&local_110);
        std::__cxx11::string::string((string *)&local_130,(string *)&sLocus1GeoStartLong);
        dVar5 = ParseLongitude(&local_130);
        locus1.geoStart.latitude = dVar4 * 0.017453292519943295;
        locus1.geoStart.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::string((string *)&local_150,(string *)&sLocus1GeoEndLat);
        dVar4 = ParseLatitude(&local_150);
        std::__cxx11::string::string((string *)&local_170,(string *)&sLocus1GeoEndLong);
        dVar5 = ParseLongitude(&local_170);
        locus1.geoEnd.latitude = dVar4 * 0.017453292519943295;
        locus1.geoEnd.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::string((string *)&local_190,(string *)&sLocus1StartLat);
        dVar4 = ParseLatitude(&local_190);
        std::__cxx11::string::string((string *)&local_1b0,(string *)&sLocus1StartLong);
        dVar5 = ParseLongitude(&local_1b0);
        locus1.locusStart.latitude = dVar4 * 0.017453292519943295;
        locus1.locusStart.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::string((string *)&local_1d0,(string *)&sLocus1EndLat);
        dVar4 = ParseLatitude(&local_1d0);
        std::__cxx11::string::string((string *)&local_1f0,(string *)&sLocus1EndLong);
        dVar5 = ParseLongitude(&local_1f0);
        locus1.locusEnd.latitude = dVar4 * 0.017453292519943295;
        locus1.locusEnd.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1d0);
        dVar4 = atof(sLocus1StartDist._M_dataplus._M_p);
        locus1.startDist = dVar4 * 1852.0;
        dVar4 = atof(sLocus1EndDist._M_dataplus._M_p);
        locus1.endDist = dVar4 * 1852.0;
        std::__cxx11::string::string((string *)&local_210,(string *)&sLocus2GeoStartLat);
        dVar4 = ParseLatitude(&local_210);
        std::__cxx11::string::string((string *)&local_230,(string *)&sLocus2GeoStartLong);
        dVar5 = ParseLongitude(&local_230);
        locus2.geoStart.latitude = dVar4 * 0.017453292519943295;
        locus2.geoStart.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::string((string *)&local_250,(string *)&sLocus2GeoEndLat);
        dVar4 = ParseLatitude(&local_250);
        std::__cxx11::string::string((string *)&local_270,(string *)&sLocus2GeoEndLong);
        dVar5 = ParseLongitude(&local_270);
        locus2.geoEnd.latitude = dVar4 * 0.017453292519943295;
        locus2.geoEnd.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::string((string *)&local_290,(string *)&sLocus2StartLat);
        dVar4 = ParseLatitude(&local_290);
        std::__cxx11::string::string((string *)&local_2b0,(string *)&sLocus2StartLong);
        dVar5 = ParseLongitude(&local_2b0);
        locus2.locusStart.latitude = dVar4 * 0.017453292519943295;
        locus2.locusStart.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::string((string *)&local_2d0,(string *)&sLocus2EndLat);
        dVar4 = ParseLatitude(&local_2d0);
        std::__cxx11::string::string((string *)&local_2f0,(string *)&sLocus2EndLong);
        dVar5 = ParseLongitude(&local_2f0);
        locus2.locusEnd.latitude = dVar4 * 0.017453292519943295;
        locus2.locusEnd.longitude = dVar5 * 0.017453292519943295;
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2d0);
        dVar4 = atof(sLocus2StartDist._M_dataplus._M_p);
        locus2.startDist = dVar4 * 1852.0;
        dVar4 = atof(sLocus2EndDist._M_dataplus._M_p);
        locus2.endDist = dVar4 * 1852.0;
        dVar4 = atof(sArcRadius._M_dataplus._M_p);
        intersection1.latitude = 0.0;
        intersection1.longitude = 0.0;
        intersection2.latitude = 0.0;
        intersection2.longitude = 0.0;
        arcCenter.latitude = 0.0;
        arcCenter.longitude = 0.0;
        iVar2 = GeoCalcs::LocusTanFixedRadiusArc
                          (&locus1,&locus2,dVar4 * 1852.0,&arcDirection,&arcCenter,&intersection1,
                           &intersection2,1e-09,5e-16);
        if (iVar2 != 0) {
          sCenterLon._M_dataplus._M_p = (pointer)(arcCenter.latitude * 57.29577951308232);
          ConvertLatitudeDdToDms_abi_cxx11_(&sCenterLat,(double *)&sCenterLon);
          sPtIntLat._M_dataplus._M_p = (pointer)(arcCenter.longitude * 57.29577951308232);
          ConvertLongitudeDdToDms_abi_cxx11_(&sCenterLon,(double *)&sPtIntLat);
          sPtIntLon._M_dataplus._M_p = (pointer)(intersection1.latitude * 57.29577951308232);
          ConvertLatitudeDdToDms_abi_cxx11_(&sPtIntLat,(double *)&sPtIntLon);
          local_6a8._M_dataplus._M_p = (pointer)(intersection1.longitude * 57.29577951308232);
          ConvertLongitudeDdToDms_abi_cxx11_(&sPtIntLon,(double *)&local_6a8);
          iVar2 = atoi(sArcDirection._M_dataplus._M_p);
          bVar1 = iVar2 == arcDirection;
          if (!bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"\n");
            poVar3 = std::operator<<(poVar3,(string *)&sTestId);
            poVar3 = std::operator<<(poVar3," failed: Expected Arc direction: ");
            poVar3 = std::operator<<(poVar3,(string *)&sArcDirection);
            poVar3 = std::operator<<(poVar3,"  calced: ");
            std::ostream::operator<<(poVar3,arcDirection);
          }
          iVar2 = std::__cxx11::string::compare((string *)&sPtIntLat);
          if (iVar2 != 0) {
            std::__cxx11::string::string((string *)&local_330,(string *)&sTanPt1Lat);
            dVar5 = ParseLatitude(&local_330);
            std::__cxx11::string::~string((string *)&local_330);
            dVar6 = ABS(dVar5 * 0.017453292519943295);
            dVar4 = ABS(intersection1.latitude);
            if (dVar6 <= ABS(intersection1.latitude)) {
              dVar4 = dVar6;
            }
            if (ABS(dVar5 * 0.017453292519943295 - intersection1.latitude) <= dVar4 * 1e-10) {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3,
                                       " within rounding tolerance of 1e-10: Tan Pt1 Latitude: ");
              poVar3 = std::operator<<(poVar3,(string *)&sTanPt1Lat);
              poVar3 = std::operator<<(poVar3," calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLat);
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3," failed: Expected Tan Pt1 latitude: ");
              poVar3 = std::operator<<(poVar3,(string *)&sTanPt1Lat);
              poVar3 = std::operator<<(poVar3,"  calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLat);
              bVar1 = false;
            }
          }
          iVar2 = std::__cxx11::string::compare((string *)&sPtIntLon);
          if (iVar2 != 0) {
            std::__cxx11::string::string((string *)&local_350,(string *)&sTanPt1Lon);
            dVar5 = ParseLongitude(&local_350);
            std::__cxx11::string::~string((string *)&local_350);
            dVar6 = ABS(dVar5 * 0.017453292519943295);
            dVar4 = ABS(intersection1.longitude);
            if (dVar6 <= ABS(intersection1.longitude)) {
              dVar4 = dVar6;
            }
            if (ABS(dVar5 * 0.017453292519943295 - intersection1.longitude) <= dVar4 * 1e-10) {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3,
                                       " within rounding tolerance of 1e-10: Tan Pt1 Longitude: ");
              poVar3 = std::operator<<(poVar3,(string *)&sTanPt1Lon);
              poVar3 = std::operator<<(poVar3," calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLon);
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3," failed: Expected Tan Pt1 longitude: ");
              poVar3 = std::operator<<(poVar3,(string *)&sTanPt1Lon);
              poVar3 = std::operator<<(poVar3,"  calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLon);
              bVar1 = false;
            }
          }
          local_7c0 = intersection2.latitude * 57.29577951308232;
          ConvertLatitudeDdToDms_abi_cxx11_(&local_6a8,&local_7c0);
          std::__cxx11::string::operator=((string *)&sPtIntLat,(string *)&local_6a8);
          std::__cxx11::string::~string((string *)&local_6a8);
          local_7c0 = intersection2.longitude * 57.29577951308232;
          ConvertLongitudeDdToDms_abi_cxx11_(&local_6a8,&local_7c0);
          std::__cxx11::string::operator=((string *)&sPtIntLon,(string *)&local_6a8);
          std::__cxx11::string::~string((string *)&local_6a8);
          iVar2 = std::__cxx11::string::compare((string *)&sPtIntLat);
          if (iVar2 != 0) {
            std::__cxx11::string::string((string *)&local_370,(string *)&sTanPt2Lat);
            dVar5 = ParseLatitude(&local_370);
            std::__cxx11::string::~string((string *)&local_370);
            dVar6 = ABS(dVar5 * 0.017453292519943295);
            dVar4 = ABS(intersection2.latitude);
            if (dVar6 <= ABS(intersection2.latitude)) {
              dVar4 = dVar6;
            }
            if (ABS(dVar5 * 0.017453292519943295 - intersection2.latitude) <= dVar4 * 1e-10) {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3,
                                       " within rounding tolerance of 1e-10: Tan Pt2 Latitude: ");
              poVar3 = std::operator<<(poVar3,(string *)&sTanPt2Lat);
              poVar3 = std::operator<<(poVar3," calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLat);
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3," failed: Expected Tan Pt2 latitude: ");
              poVar3 = std::operator<<(poVar3,(string *)&sTanPt2Lat);
              poVar3 = std::operator<<(poVar3,"  calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLat);
              bVar1 = false;
            }
          }
          iVar2 = std::__cxx11::string::compare((string *)&sPtIntLon);
          if (iVar2 != 0) {
            std::__cxx11::string::string((string *)&local_390,(string *)&sTanPt2Lon);
            dVar5 = ParseLongitude(&local_390);
            std::__cxx11::string::~string((string *)&local_390);
            dVar6 = ABS(dVar5 * 0.017453292519943295);
            dVar4 = ABS(intersection2.longitude);
            if (dVar6 <= ABS(intersection2.longitude)) {
              dVar4 = dVar6;
            }
            if (ABS(dVar5 * 0.017453292519943295 - intersection2.longitude) <= dVar4 * 1e-10) {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3,
                                       " within rounding tolerance of 1e-10: Tan Pt2 Longitude: ");
              poVar3 = std::operator<<(poVar3,(string *)&sTanPt2Lon);
              poVar3 = std::operator<<(poVar3," calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLon);
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,"\n");
              poVar3 = std::operator<<(poVar3,(string *)&sTestId);
              poVar3 = std::operator<<(poVar3," failed: Expected Tan Pt2 longitude: ");
              poVar3 = std::operator<<(poVar3,(string *)&sTanPt2Lon);
              poVar3 = std::operator<<(poVar3,"  calced: ");
              std::operator<<(poVar3,(string *)&sPtIntLon);
              bVar1 = false;
            }
          }
          std::__cxx11::string::~string((string *)&sPtIntLon);
          std::__cxx11::string::~string((string *)&sPtIntLat);
          std::__cxx11::string::~string((string *)&sCenterLon);
          std::__cxx11::string::~string((string *)&sCenterLat);
          goto LAB_00146057;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"\n");
        poVar3 = std::operator<<(poVar3,(string *)&sTestId);
        std::operator<<(poVar3,"failed: Expected solution, found none.");
      }
    }
  }
  bVar1 = false;
LAB_00146057:
  std::__cxx11::string::~string((string *)&sTestId);
  std::__cxx11::string::~string((string *)&sTanPt2Lon);
  std::__cxx11::string::~string((string *)&sTanPt2Lat);
  std::__cxx11::string::~string((string *)&sTanPt1Lon);
  std::__cxx11::string::~string((string *)&sTanPt1Lat);
  std::__cxx11::string::~string((string *)&sArcCenterLon);
  std::__cxx11::string::~string((string *)&sArcCenterLat);
  std::__cxx11::string::~string((string *)&sArcDirection);
  std::__cxx11::string::~string((string *)&sArcRadius);
  std::__cxx11::string::~string((string *)&sLocus2EndDist);
  std::__cxx11::string::~string((string *)&sLocus2StartDist);
  std::__cxx11::string::~string((string *)&sLocus2EndLong);
  std::__cxx11::string::~string((string *)&sLocus2EndLat);
  std::__cxx11::string::~string((string *)&sLocus2StartLong);
  std::__cxx11::string::~string((string *)&sLocus2StartLat);
  std::__cxx11::string::~string((string *)&sLocus2GeoEndLong);
  std::__cxx11::string::~string((string *)&sLocus2GeoEndLat);
  std::__cxx11::string::~string((string *)&sLocus2GeoStartLong);
  std::__cxx11::string::~string((string *)&sLocus2GeoStartLat);
  std::__cxx11::string::~string((string *)&sLocus1EndDist);
  std::__cxx11::string::~string((string *)&sLocus1StartDist);
  std::__cxx11::string::~string((string *)&sLocus1EndLong);
  std::__cxx11::string::~string((string *)&sLocus1EndLat);
  std::__cxx11::string::~string((string *)&sLocus1StartLong);
  std::__cxx11::string::~string((string *)&sLocus1StartLat);
  std::__cxx11::string::~string((string *)&sLocus1GeoEndLong);
  std::__cxx11::string::~string((string *)&sLocus1GeoEndLat);
  std::__cxx11::string::~string((string *)&sLocus1GeoStartLong);
  std::__cxx11::string::~string((string *)&sLocus1GeoStartLat);
  return bVar1;
}

Assistant:

bool ParseLocusTanFixedRadiusArc(string sLine1, string sLine2, string sLine3)
{
    bool bPassed = true;

    string sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat, sLocus1GeoEndLong;
    string sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong;
    string sLocus1StartDist, sLocus1EndDist;

    string sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat, sLocus2GeoEndLong;
    string sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong;
    string sLocus2StartDist, sLocus2EndDist;
    string sArcRadius;

    string sArcDirection, sArcCenterLat, sArcCenterLon, sTanPt1Lat, sTanPt1Lon, sTanPt2Lat, sTanPt2Lon;

    string sTestId;

    if (!ParseLocusTanFixedRadiusArc1(sLine1, sTestId, sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat,
                                      sLocus1GeoEndLong,
                                      sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong,
                                      sLocus1StartDist, sLocus1EndDist))
        return false;

    if (!ParseLocusTanFixedRadiusArc2(sLine2, sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat,
                                      sLocus2GeoEndLong,
                                      sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong,
                                      sLocus2StartDist, sLocus2EndDist, sArcRadius))
        return false;

    if (!ParseLocusTanFixedRadiusArc3(sLine3, sArcDirection, sArcCenterLat, sArcCenterLon, sTanPt1Lat, sTanPt1Lon,
                                      sTanPt2Lat, sTanPt2Lon))
        return false;

    Locus locus1, locus2;
    locus1.geoStart.Set(Deg2Rad(ParseLatitude(sLocus1GeoStartLat)), Deg2Rad(ParseLongitude(sLocus1GeoStartLong)));
    locus1.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus1GeoEndLat)), Deg2Rad(ParseLongitude(sLocus1GeoEndLong)));
    locus1.locusStart.Set(Deg2Rad(ParseLatitude(sLocus1StartLat)), Deg2Rad(ParseLongitude(sLocus1StartLong)));
    locus1.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus1EndLat)), Deg2Rad(ParseLongitude(sLocus1EndLong)));
    locus1.startDist = NmToMeters(atof(sLocus1StartDist.c_str()));
    locus1.endDist = NmToMeters(atof(sLocus1EndDist.c_str()));

    locus2.geoStart.Set(Deg2Rad(ParseLatitude(sLocus2GeoStartLat)), Deg2Rad(ParseLongitude(sLocus2GeoStartLong)));
    locus2.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus2GeoEndLat)), Deg2Rad(ParseLongitude(sLocus2GeoEndLong)));
    locus2.locusStart.Set(Deg2Rad(ParseLatitude(sLocus2StartLat)), Deg2Rad(ParseLongitude(sLocus2StartLong)));
    locus2.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus2EndLat)), Deg2Rad(ParseLongitude(sLocus2EndLong)));
    locus2.startDist = NmToMeters(atof(sLocus2StartDist.c_str()));
    locus2.endDist = NmToMeters(atof(sLocus2EndDist.c_str()));

    double arcRadius = NmToMeters(atof(sArcRadius.c_str()));
    int arcDirection;
    LLPoint intersection1, intersection2;
    LLPoint arcCenter;
    int nVal = LocusTanFixedRadiusArc(locus1, locus2, arcRadius, arcDirection, arcCenter,
                                      intersection1, intersection2, kTol, kEps);

    if (nVal == 0)
    {
        cout << "\n" << sTestId << "failed: Expected solution, found none.";
        bPassed = false;

    }
    else
    {
        string sCenterLat = ConvertLatitudeDdToDms(Rad2Deg(arcCenter.latitude));
        string sCenterLon = ConvertLongitudeDdToDms(Rad2Deg(arcCenter.longitude));
        string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection1.latitude));
        string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection1.longitude));

        if (atoi(sArcDirection.c_str()) != arcDirection)
        {
            cout << "\n" << sTestId << " failed: Expected Arc direction: " << sArcDirection << "  calced: " <<
            arcDirection;
            bPassed = false;
        }

        if (sPtIntLat.compare(sTanPt1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt1Lat));
            if (IsApprox(dLat, intersection1.latitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt1 Latitude: " << sTanPt1Lat <<
                " calced: " << sPtIntLat;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt1 latitude: " << sTanPt1Lat << "  calced: " <<
                sPtIntLat;
                bPassed = false;
            }
        }
        if (sPtIntLon.compare(sTanPt1Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt1Lon));
            if (IsApprox(dLon, intersection1.longitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt1 Longitude: " << sTanPt1Lon <<
                " calced: " << sPtIntLon;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt1 longitude: " << sTanPt1Lon << "  calced: " <<
                sPtIntLon;
                bPassed = false;
            }
        }

        sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection2.latitude));
        sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection2.longitude));

        if (sPtIntLat.compare(sTanPt2Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt2Lat));
            if (IsApprox(dLat, intersection2.latitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt2 Latitude: " << sTanPt2Lat <<
                " calced: " << sPtIntLat;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt2 latitude: " << sTanPt2Lat << "  calced: " <<
                sPtIntLat;
                bPassed = false;
            }
        }
        if (sPtIntLon.compare(sTanPt2Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt2Lon));
            if (IsApprox(dLon, intersection2.longitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt2 Longitude: " << sTanPt2Lon <<
                " calced: " << sPtIntLon;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt2 longitude: " << sTanPt2Lon << "  calced: " <<
                sPtIntLon;
                bPassed = false;
            }
        }

    }
    return bPassed;
}